

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall
ON_Annotation::SetStackFractionFormat
          (ON_Annotation *this,ON_DimStyle *parent_style,stack_format value)

{
  stack_format sVar1;
  ON_DimStyle *pOVar2;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  sVar1 = ON_DimStyle::StackFractionFormat(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,sVar1 != value);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetStackFractionFormat(pOVar2,value);
    ON_DimStyle::SetFieldOverride(pOVar2,StackFormat,sVar1 != value);
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetStackFractionFormat(const ON_DimStyle* parent_style, ON_DimStyle::stack_format value)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (value != parent_style->StackFractionFormat());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetStackFractionFormat(value);
    override_style->SetFieldOverride(ON_DimStyle::field::StackFormat, bCreate);
  }
}